

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O1

Result __thiscall
testing::internal::
FunctionMocker<void_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::Error)>
::PerformDefaultAction
          (FunctionMocker<void_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::Error)>
           *this,ArgumentTuple *args,string *call_description)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  bool bVar4;
  Action<void_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::Error)>
  *this_00;
  __normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>
  __tmp;
  pointer ppvVar5;
  _Alloc_hider _Var6;
  OnCallSpec<void_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::Error)>
  *this_01;
  string message;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  ArgumentTuple local_60;
  
  ppvVar5 = (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
            super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  do {
    if (ppvVar5 ==
        (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
        super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      this_01 = (OnCallSpec<void_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::Error)>
                 *)0x0;
      break;
    }
    this_01 = (OnCallSpec<void_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::Error)>
               *)ppvVar5[-1];
    ppvVar5 = ppvVar5 + -1;
    bVar4 = OnCallSpec<void_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::Error)>
            ::Matches(this_01,args);
  } while (!bVar4);
  if (this_01 ==
      (OnCallSpec<void_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::Error)>
       *)0x0) {
    pcVar3 = (call_description->_M_dataplus)._M_p;
    local_80[0] = &local_70;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_80,pcVar3,pcVar3 + call_description->_M_string_length);
    std::__cxx11::string::append((char *)local_80);
    _Var6._M_p = (pointer)local_80[0];
    if (local_80[0] == &local_70) {
      return;
    }
  }
  else {
    this_00 = OnCallSpec<void_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::Error)>
              ::GetAction(this_01);
    local_60.
    super__Tuple_impl<0UL,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::Error>
    .super__Tuple_impl<1UL,_ot::commissioner::Error>.
    super__Head_base<1UL,_ot::commissioner::Error,_false>._M_head_impl.mCode =
         (args->
         super__Tuple_impl<0UL,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::Error>
         ).super__Tuple_impl<1UL,_ot::commissioner::Error>.
         super__Head_base<1UL,_ot::commissioner::Error,_false>._M_head_impl.mCode;
    paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)((long)&local_60.
                        super__Tuple_impl<0UL,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::Error>
                        .super__Tuple_impl<1UL,_ot::commissioner::Error>.
                        super__Head_base<1UL,_ot::commissioner::Error,_false>._M_head_impl.mMessage
                + 0x10);
    local_60.
    super__Tuple_impl<0UL,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::Error>
    .super__Tuple_impl<1UL,_ot::commissioner::Error>.
    super__Head_base<1UL,_ot::commissioner::Error,_false>._M_head_impl.mMessage._M_dataplus._M_p =
         (args->
         super__Tuple_impl<0UL,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::Error>
         ).super__Tuple_impl<1UL,_ot::commissioner::Error>.
         super__Head_base<1UL,_ot::commissioner::Error,_false>._M_head_impl.mMessage._M_dataplus.
         _M_p;
    paVar1 = &(args->
              super__Tuple_impl<0UL,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::Error>
              ).super__Tuple_impl<1UL,_ot::commissioner::Error>.
              super__Head_base<1UL,_ot::commissioner::Error,_false>._M_head_impl.mMessage.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60.
           super__Tuple_impl<0UL,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::Error>
           .super__Tuple_impl<1UL,_ot::commissioner::Error>.
           super__Head_base<1UL,_ot::commissioner::Error,_false>._M_head_impl.mMessage._M_dataplus.
           _M_p == paVar1) {
      local_60.
      super__Tuple_impl<0UL,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::Error>
      .super__Tuple_impl<1UL,_ot::commissioner::Error>.
      super__Head_base<1UL,_ot::commissioner::Error,_false>._M_head_impl.mMessage.field_2.
      _M_allocated_capacity = paVar1->_M_allocated_capacity;
      local_60.
      super__Tuple_impl<0UL,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::Error>
      .super__Tuple_impl<1UL,_ot::commissioner::Error>.
      super__Head_base<1UL,_ot::commissioner::Error,_false>._M_head_impl.mMessage.field_2._8_8_ =
           *(undefined8 *)
            ((long)&(args->
                    super__Tuple_impl<0UL,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::Error>
                    ).super__Tuple_impl<1UL,_ot::commissioner::Error>.
                    super__Head_base<1UL,_ot::commissioner::Error,_false>._M_head_impl.mMessage.
                    field_2 + 8);
      local_60.
      super__Tuple_impl<0UL,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::Error>
      .super__Tuple_impl<1UL,_ot::commissioner::Error>.
      super__Head_base<1UL,_ot::commissioner::Error,_false>._M_head_impl.mMessage._M_dataplus._M_p =
           (pointer)paVar2;
    }
    else {
      local_60.
      super__Tuple_impl<0UL,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::Error>
      .super__Tuple_impl<1UL,_ot::commissioner::Error>.
      super__Head_base<1UL,_ot::commissioner::Error,_false>._M_head_impl.mMessage.field_2.
      _M_allocated_capacity = paVar1->_M_allocated_capacity;
    }
    local_60.
    super__Tuple_impl<0UL,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::Error>
    .super__Tuple_impl<1UL,_ot::commissioner::Error>.
    super__Head_base<1UL,_ot::commissioner::Error,_false>._M_head_impl.mMessage._M_string_length =
         (args->
         super__Tuple_impl<0UL,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::Error>
         ).super__Tuple_impl<1UL,_ot::commissioner::Error>.
         super__Head_base<1UL,_ot::commissioner::Error,_false>._M_head_impl.mMessage.
         _M_string_length;
    (args->
    super__Tuple_impl<0UL,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::Error>
    ).super__Tuple_impl<1UL,_ot::commissioner::Error>.
    super__Head_base<1UL,_ot::commissioner::Error,_false>._M_head_impl.mMessage._M_dataplus._M_p =
         (pointer)paVar1;
    (args->
    super__Tuple_impl<0UL,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::Error>
    ).super__Tuple_impl<1UL,_ot::commissioner::Error>.
    super__Head_base<1UL,_ot::commissioner::Error,_false>._M_head_impl.mMessage._M_string_length = 0
    ;
    (args->
    super__Tuple_impl<0UL,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::Error>
    ).super__Tuple_impl<1UL,_ot::commissioner::Error>.
    super__Head_base<1UL,_ot::commissioner::Error,_false>._M_head_impl.mMessage.field_2._M_local_buf
    [0] = '\0';
    local_60.
    super__Tuple_impl<0UL,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::Error>
    .
    super__Head_base<0UL,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_false>
    ._M_head_impl =
         (args->
         super__Tuple_impl<0UL,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::Error>
         ).
         super__Head_base<0UL,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_false>
         ._M_head_impl;
    Action<void_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::Error)>
    ::Perform(this_00,&local_60);
    _Var6._M_p = local_60.
                 super__Tuple_impl<0UL,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::Error>
                 .super__Tuple_impl<1UL,_ot::commissioner::Error>.
                 super__Head_base<1UL,_ot::commissioner::Error,_false>._M_head_impl.mMessage.
                 _M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60.
           super__Tuple_impl<0UL,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::Error>
           .super__Tuple_impl<1UL,_ot::commissioner::Error>.
           super__Head_base<1UL,_ot::commissioner::Error,_false>._M_head_impl.mMessage._M_dataplus.
           _M_p == paVar2) {
      return;
    }
  }
  operator_delete(_Var6._M_p);
  return;
}

Assistant:

Result PerformDefaultAction(ArgumentTuple&& args,
                              const std::string& call_description) const {
    const OnCallSpec<F>* const spec =
        this->FindOnCallSpec(args);
    if (spec != nullptr) {
      return spec->GetAction().Perform(std::move(args));
    }
    const std::string message =
        call_description +
        "\n    The mock function has no default action "
        "set, and its return type has no default value set.";
#if GTEST_HAS_EXCEPTIONS
    if (!DefaultValue<Result>::Exists()) {
      throw std::runtime_error(message);
    }
#else
    Assert(DefaultValue<Result>::Exists(), "", -1, message);
#endif
    return DefaultValue<Result>::Get();
  }